

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::ComplexOptionType1::_InternalSerialize
          (ComplexOptionType1 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint8_t *puVar4;
  const_reference piVar5;
  int index;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.foo_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.foo2_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.foo3_,target);
  }
  this_00 = &(this->field_0)._impl_.foo4_;
  iVar3 = google::protobuf::RepeatedField<int>::size(this_00);
  index = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != index; index = index + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar5 = google::protobuf::RepeatedField<int>::Get(this_00,index);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,*piVar5,puVar4);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_ComplexOptionType1_default_instance_,target,stream);
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),puVar4,stream);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ComplexOptionType1::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ComplexOptionType1& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.ComplexOptionType1)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 foo = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_foo(), target);
  }

  // optional int32 foo2 = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_foo2(), target);
  }

  // optional int32 foo3 = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_foo3(), target);
  }

  // repeated int32 foo4 = 4;
  for (int i = 0, n = this_._internal_foo4_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        4, this_._internal_foo4().Get(i), target);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.ComplexOptionType1)
  return target;
}